

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_impl.h
# Opt level: O0

void secp256k1_sha256_finalize(secp256k1_sha256 *hash,uchar *out32)

{
  int local_4c;
  undefined8 uStack_48;
  int i;
  uint32_t out [8];
  uint local_20;
  uint local_1c;
  uint32_t sizedesc [2];
  uchar *out32_local;
  secp256k1_sha256 *hash_local;
  
  local_20 = (uint)((hash->bytes >> 0x1d & 0xff) << 0x18) |
             (uint)((hash->bytes >> 0x1d & 0xff00) << 8) | (uint)(hash->bytes >> 0x25) & 0xff00 |
             (uint)(hash->bytes >> 0x35) & 0xff;
  local_1c = (uint)((hash->bytes & 0x1f) << 0x1b) | (uint)((hash->bytes & 0x1fe0) << 0xb) |
             (uint)(((hash->bytes & 0x1fe000) << 3) >> 8) |
             (uint)(((hash->bytes & 0x1fe00000) << 3) >> 0x18);
  sizedesc = (uint32_t  [2])out32;
  secp256k1_sha256_write
            (hash,secp256k1_sha256_finalize::pad,(0x77 - (hash->bytes & 0x3f) & 0x3f) + 1);
  secp256k1_sha256_write(hash,(uchar *)&local_20,8);
  for (local_4c = 0; local_4c < 8; local_4c = local_4c + 1) {
    out[(long)local_4c + -2] =
         hash->s[local_4c] << 0x18 | (hash->s[local_4c] & 0xff00) << 8 |
         (hash->s[local_4c] & 0xff0000) >> 8 | hash->s[local_4c] >> 0x18;
    hash->s[local_4c] = 0;
  }
  *(undefined8 *)sizedesc = uStack_48;
  *(undefined8 *)((long)sizedesc + 8) = out._0_8_;
  *(undefined8 *)((long)sizedesc + 0x10) = out._8_8_;
  *(undefined8 *)((long)sizedesc + 0x18) = out._16_8_;
  return;
}

Assistant:

static void secp256k1_sha256_finalize(secp256k1_sha256 *hash, unsigned char *out32) {
    static const unsigned char pad[64] = {0x80, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0};
    uint32_t sizedesc[2];
    uint32_t out[8];
    int i = 0;
    sizedesc[0] = BE32(hash->bytes >> 29);
    sizedesc[1] = BE32(hash->bytes << 3);
    secp256k1_sha256_write(hash, pad, 1 + ((119 - (hash->bytes % 64)) % 64));
    secp256k1_sha256_write(hash, (const unsigned char*)sizedesc, 8);
    for (i = 0; i < 8; i++) {
        out[i] = BE32(hash->s[i]);
        hash->s[i] = 0;
    }
    memcpy(out32, (const unsigned char*)out, 32);
}